

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O1

void handle_level_stairs(chunk *c,_Bool persistent,wchar_t down_count,wchar_t up_count)

{
  wchar_t wVar1;
  chunk_conflict *pcVar2;
  wchar_t wVar3;
  int iVar4;
  undefined7 in_register_00000031;
  
  iVar4 = (int)CONCAT71(in_register_00000031,persistent);
  wVar1 = c->height;
  if (c->width < c->height) {
    wVar1 = c->width;
  }
  wVar3 = wVar1 + L'\x03';
  if (L'\xffffffff' < wVar1) {
    wVar3 = wVar1;
  }
  wVar3 = wVar3 >> 2;
  wVar1 = iVar4 * 4;
  if (wVar3 == wVar1 || SBORROW4(wVar3,wVar1) != wVar3 + iVar4 * -4 < 0) {
    wVar3 = wVar1;
  }
  if (iVar4 != 0) {
    pcVar2 = chunk_find_adjacent(c->depth,"down");
    if (pcVar2 != (chunk_conflict *)0x0) goto LAB_00148c72;
  }
  alloc_stairs((chunk_conflict *)c,FEAT_MORE,down_count,wVar3,false,dun->one_off_below);
LAB_00148c72:
  if (persistent) {
    pcVar2 = chunk_find_adjacent(c->depth,"up");
    if (pcVar2 != (chunk_conflict *)0x0) {
      return;
    }
  }
  alloc_stairs((chunk_conflict *)c,FEAT_LESS,up_count,wVar3,false,dun->one_off_above);
  return;
}

Assistant:

static void handle_level_stairs(struct chunk *c, bool persistent,
		int down_count, int up_count)
{
	/*
	 * For persistent levels, require that the stairs be at least four
	 * grids apart (two for surrounding walls; two for a buffer between
	 * the walls; the buffer space could be one - shared by the
	 * staircases - but the reservations in the room map don't allow for
	 * that) so the staircase rooms in the connecting level won't overlap.
	 * For both the persistent and non-persistent case, also require that
	 * the stairs be at least 1/4th of the level's diameter (PowerDiver's
	 * suggestion) apart to prevent them from all appearing in certain
	 * rooms.
	 */
	int minsep = MAX(MIN(c->width, c->height) / 4, (persistent) ? 4 : 0);

	if (!persistent || !chunk_find_adjacent(c->depth, "down")) {
		alloc_stairs(c, FEAT_MORE, down_count, minsep, false,
			dun->one_off_below);
	}
	if (!persistent || !chunk_find_adjacent(c->depth, "up")) {
		alloc_stairs(c, FEAT_LESS, up_count, minsep, false,
			dun->one_off_above);
	}
}